

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_path.cpp
# Opt level: O0

DWORD GetTempPathW(DWORD nBufferLength,LPWSTR lpBuffer)

{
  long lVar1;
  LPCSTR lpMultiByteStr;
  LPWSTR lpWideCharStr;
  CHAR *pCVar2;
  int iVar3;
  long in_FS_OFFSET;
  undefined8 uStack_50;
  CHAR aCStack_48 [4];
  DWORD local_44;
  LPCSTR local_40;
  uint local_38;
  DWORD local_34;
  ulong uStack_30;
  DWORD dwRetVal;
  unsigned_long __vla_expr0;
  LPWSTR local_20;
  LPWSTR lpBuffer_local;
  DWORD nBufferLength_local;
  
  _nBufferLength_local = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = lpBuffer;
  lpBuffer_local._0_4_ = nBufferLength;
  if (!PAL_InitializeChakraCoreCalled) {
    uStack_50 = 0x3b58ed;
    abort();
  }
  if (lpBuffer == (LPWSTR)0x0) {
    if (!PAL_InitializeChakraCoreCalled) {
      uStack_50 = 0x3b5905;
      abort();
    }
    uStack_50 = 0x3b590f;
    SetLastError(0x57);
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      uStack_50 = 0x3b5920;
      abort();
    }
    lpBuffer_local._4_4_ = 0;
    pCVar2 = aCStack_48;
  }
  else {
    local_38 = nBufferLength;
    if (nBufferLength == 0) {
      local_38 = 1;
    }
    uStack_30 = (ulong)local_38;
    lVar1 = -(uStack_30 + 0xf & 0xfffffffffffffff0);
    local_40 = aCStack_48 + lVar1;
    __vla_expr0 = (unsigned_long)aCStack_48;
    *(undefined8 *)((long)&uStack_50 + lVar1) = 0x3b5974;
    local_34 = GetTempPathA(nBufferLength,aCStack_48 + lVar1);
    lpWideCharStr = local_20;
    lpMultiByteStr = local_40;
    if (local_34 < (DWORD)lpBuffer_local) {
      if (local_34 == 0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          *(undefined8 *)((long)&uStack_50 + lVar1) = 0x3b5a3c;
          abort();
        }
        *local_20 = L'\0';
      }
      else {
        iVar3 = local_34 + 1;
        *(undefined8 *)((long)&uStack_50 + lVar1) = 0x3b59cc;
        iVar3 = MultiByteToWideChar(0,0,lpMultiByteStr,-1,lpWideCharStr,iVar3);
        if (iVar3 == 0) {
          *(undefined8 *)((long)&uStack_50 + lVar1) = 0x3b5a00;
          fprintf(_stderr,"] %s %s:%d","GetTempPathW",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/pal_path.cpp"
                  ,0x254);
          *(undefined8 *)((long)&uStack_50 + lVar1) = 0x3b5a18;
          fprintf(_stderr,"An error occurred while converting the string to wide.\n");
          *(undefined8 *)((long)&uStack_50 + lVar1) = 0x3b5a22;
          SetLastError(0x54f);
          local_34 = 0;
        }
      }
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        *(undefined8 *)((long)&uStack_50 + lVar1) = 0x3b5990;
        abort();
      }
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x3b599a;
      SetLastError(0x7a);
      *local_20 = L'\0';
    }
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      *(undefined8 *)((long)&uStack_50 + lVar1) = 0x3b5a58;
      abort();
    }
    lpBuffer_local._4_4_ = local_34;
    pCVar2 = (CHAR *)__vla_expr0;
  }
  local_44 = lpBuffer_local._4_4_;
  if (*(long *)(in_FS_OFFSET + 0x28) != _nBufferLength_local) {
    pCVar2[-8] = -0x76;
    pCVar2[-7] = 'Z';
    pCVar2[-6] = ';';
    pCVar2[-5] = '\0';
    pCVar2[-4] = '\0';
    pCVar2[-3] = '\0';
    pCVar2[-2] = '\0';
    pCVar2[-1] = '\0';
    __stack_chk_fail();
  }
  return lpBuffer_local._4_4_;
}

Assistant:

DWORD
PALAPI
GetTempPathW(
	     IN DWORD nBufferLength,
	     OUT LPWSTR lpBuffer)
{
    PERF_ENTRY(GetTempPathW);
    ENTRY("GetTempPathW(nBufferLength=%u, lpBuffer=%p)\n",
          nBufferLength, lpBuffer);

    if (!lpBuffer)
    {
        ERROR("lpBuffer was not a valid pointer.\n");
        SetLastError(ERROR_INVALID_PARAMETER);
        LOGEXIT("GetTempPathW returns DWORD 0\n");
        PERF_EXIT(GetTempPathW);
        return 0;
    }

    char TempBuffer[nBufferLength > 0 ? nBufferLength : 1];
    DWORD dwRetVal = GetTempPathA( nBufferLength, TempBuffer );

    if ( dwRetVal >= nBufferLength )
    {
        ERROR( "lpBuffer was not large enough.\n" );
        SetLastError( ERROR_INSUFFICIENT_BUFFER );
        *lpBuffer = '\0';
    }
    else if ( dwRetVal != 0 )
    {
        /* Convert to wide. */
        if ( 0 == MultiByteToWideChar( CP_ACP, 0, TempBuffer, -1,
                                       lpBuffer, dwRetVal + 1 ) )
        {
            ASSERT( "An error occurred while converting the string to wide.\n" );
            SetLastError( ERROR_INTERNAL_ERROR );
            dwRetVal = 0;
        }
    }
    else
    {
        ERROR( "The function failed.\n" );
        *lpBuffer = '\0';
    }

    LOGEXIT("GetTempPathW returns DWORD %u\n", dwRetVal );
    PERF_EXIT(GetTempPathW);
    return dwRetVal;
}